

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition.cpp
# Opt level: O2

int main(void)

{
  _Head_base<0UL,_tf::Node_*,_false> this;
  _Head_base<0UL,_tf::Node_*,_false> v;
  _Head_base<0UL,_tf::Node_*,_false> this_00;
  _Head_base<0UL,_tf::Node_*,_false> v_00;
  FlowBuilder FVar1;
  uint uVar2;
  Executor *this_01;
  int counter;
  Taskflow taskflow;
  Executor executor;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_23c [4];
  shared_ptr<tf::WorkerInterface> local_238;
  Taskflow local_228;
  Executor local_160;
  
  uVar2 = std::thread::hardware_concurrency();
  local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_160,(ulong)uVar2,&local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"Conditional Tasking Demo",local_23c);
  tf::Taskflow::Taskflow(&local_228,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  FVar1._graph = local_228.super_FlowBuilder._graph;
  local_260._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_260._M_dataplus._M_p[0] = '\0';
  local_260._M_dataplus._M_p[1] = '\0';
  local_260._M_dataplus._M_p[2] = '\0';
  local_260._M_dataplus._M_p[3] = '\0';
  local_260._M_dataplus._M_p[4] = '\0';
  local_260._M_dataplus._M_p[5] = '\0';
  local_260._M_dataplus._M_p[6] = '\0';
  local_260._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_260._M_dataplus._M_p + 8) = local_260._M_dataplus._M_p + 0x18;
  local_260._M_dataplus._M_p[0x10] = '\0';
  local_260._M_dataplus._M_p[0x11] = '\0';
  local_260._M_dataplus._M_p[0x12] = '\0';
  local_260._M_dataplus._M_p[0x13] = '\0';
  local_260._M_dataplus._M_p[0x14] = '\0';
  local_260._M_dataplus._M_p[0x15] = '\0';
  local_260._M_dataplus._M_p[0x16] = '\0';
  local_260._M_dataplus._M_p[0x17] = '\0';
  local_260._M_dataplus._M_p[0x18] = '\0';
  local_260._M_dataplus._M_p[0x28] = '\0';
  local_260._M_dataplus._M_p[0x29] = '\0';
  local_260._M_dataplus._M_p[0x2a] = '\0';
  local_260._M_dataplus._M_p[0x2b] = '\0';
  local_260._M_dataplus._M_p[0x2c] = '\0';
  local_260._M_dataplus._M_p[0x2d] = '\0';
  local_260._M_dataplus._M_p[0x2e] = '\0';
  local_260._M_dataplus._M_p[0x2f] = '\0';
  local_260._M_dataplus._M_p[0x30] = '\0';
  local_260._M_dataplus._M_p[0x31] = '\0';
  local_260._M_dataplus._M_p[0x32] = '\0';
  local_260._M_dataplus._M_p[0x33] = '\0';
  local_260._M_dataplus._M_p[0x34] = '\0';
  local_260._M_dataplus._M_p[0x35] = '\0';
  local_260._M_dataplus._M_p[0x36] = '\0';
  local_260._M_dataplus._M_p[0x37] = '\0';
  local_260._M_dataplus._M_p[0x38] = '\0';
  local_260._M_dataplus._M_p[0x39] = '\0';
  local_260._M_dataplus._M_p[0x3a] = '\0';
  local_260._M_dataplus._M_p[0x3b] = '\0';
  local_260._M_dataplus._M_p[0x3c] = '\0';
  local_260._M_dataplus._M_p[0x3d] = '\0';
  local_260._M_dataplus._M_p[0x3e] = '\0';
  local_260._M_dataplus._M_p[0x3f] = '\0';
  local_260._M_dataplus._M_p[0x40] = '\0';
  local_260._M_dataplus._M_p[0x41] = '\0';
  local_260._M_dataplus._M_p[0x42] = '\0';
  local_260._M_dataplus._M_p[0x43] = '\0';
  local_260._M_dataplus._M_p[0x44] = '\0';
  local_260._M_dataplus._M_p[0x45] = '\0';
  local_260._M_dataplus._M_p[0x46] = '\0';
  local_260._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_260._M_dataplus._M_p + 0x48) = local_260._M_dataplus._M_p + 0x60;
  *(pointer *)(local_260._M_dataplus._M_p + 0x50) = local_260._M_dataplus._M_p + 0x60;
  *(pointer *)(local_260._M_dataplus._M_p + 0x58) = local_260._M_dataplus._M_p + 0x80;
  local_260._M_dataplus._M_p[0x80] = '\0';
  local_260._M_dataplus._M_p[0x81] = '\0';
  local_260._M_dataplus._M_p[0x82] = '\0';
  local_260._M_dataplus._M_p[0x83] = '\0';
  local_260._M_dataplus._M_p[0x84] = '\0';
  local_260._M_dataplus._M_p[0x85] = '\0';
  local_260._M_dataplus._M_p[0x86] = '\0';
  local_260._M_dataplus._M_p[0x87] = '\0';
  local_260._M_dataplus._M_p[0x90] = '\0';
  local_260._M_dataplus._M_p[0x91] = '\0';
  local_260._M_dataplus._M_p[0x92] = '\0';
  local_260._M_dataplus._M_p[0x93] = '\0';
  local_260._M_dataplus._M_p[0x94] = '\0';
  local_260._M_dataplus._M_p[0x95] = '\0';
  local_260._M_dataplus._M_p[0x96] = '\0';
  local_260._M_dataplus._M_p[0x97] = '\0';
  *(allocator<char> **)(local_260._M_dataplus._M_p + 0x88) = local_23c;
  *(code **)(local_260._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/condition.cpp:29:29)>
       ::_M_invoke;
  *(code **)(local_260._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/condition.cpp:29:29)>
       ::_M_manager;
  local_260._M_dataplus._M_p[0xc0] = '\x01';
  local_260._M_dataplus._M_p[200] = '\0';
  local_260._M_dataplus._M_p[0xc9] = '\0';
  local_260._M_dataplus._M_p[0xca] = '\0';
  local_260._M_dataplus._M_p[0xcb] = '\0';
  local_260._M_dataplus._M_p[0xcc] = '\0';
  local_260._M_dataplus._M_p[0xcd] = '\0';
  local_260._M_dataplus._M_p[0xce] = '\0';
  local_260._M_dataplus._M_p[0xcf] = '\0';
  local_260._M_dataplus._M_p[0xd0] = '\0';
  local_260._M_dataplus._M_p[0xd1] = '\0';
  local_260._M_dataplus._M_p[0xd2] = '\0';
  local_260._M_dataplus._M_p[0xd3] = '\0';
  local_260._M_dataplus._M_p[0xd4] = '\0';
  local_260._M_dataplus._M_p[0xd5] = '\0';
  local_260._M_dataplus._M_p[0xd6] = '\0';
  local_260._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar1._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_260);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_260);
  this._M_head_impl =
       ((FVar1._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"A",&local_261);
  std::__cxx11::string::_M_assign((string *)&(this._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_260);
  FVar1._graph = local_228.super_FlowBuilder._graph;
  local_260._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_260._M_dataplus._M_p[0] = '\0';
  local_260._M_dataplus._M_p[1] = '\0';
  local_260._M_dataplus._M_p[2] = '\0';
  local_260._M_dataplus._M_p[3] = '\0';
  local_260._M_dataplus._M_p[4] = '\0';
  local_260._M_dataplus._M_p[5] = '\0';
  local_260._M_dataplus._M_p[6] = '\0';
  local_260._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_260._M_dataplus._M_p + 8) = local_260._M_dataplus._M_p + 0x18;
  local_260._M_dataplus._M_p[0x10] = '\0';
  local_260._M_dataplus._M_p[0x11] = '\0';
  local_260._M_dataplus._M_p[0x12] = '\0';
  local_260._M_dataplus._M_p[0x13] = '\0';
  local_260._M_dataplus._M_p[0x14] = '\0';
  local_260._M_dataplus._M_p[0x15] = '\0';
  local_260._M_dataplus._M_p[0x16] = '\0';
  local_260._M_dataplus._M_p[0x17] = '\0';
  local_260._M_dataplus._M_p[0x18] = '\0';
  local_260._M_dataplus._M_p[0x28] = '\0';
  local_260._M_dataplus._M_p[0x29] = '\0';
  local_260._M_dataplus._M_p[0x2a] = '\0';
  local_260._M_dataplus._M_p[0x2b] = '\0';
  local_260._M_dataplus._M_p[0x2c] = '\0';
  local_260._M_dataplus._M_p[0x2d] = '\0';
  local_260._M_dataplus._M_p[0x2e] = '\0';
  local_260._M_dataplus._M_p[0x2f] = '\0';
  local_260._M_dataplus._M_p[0x30] = '\0';
  local_260._M_dataplus._M_p[0x31] = '\0';
  local_260._M_dataplus._M_p[0x32] = '\0';
  local_260._M_dataplus._M_p[0x33] = '\0';
  local_260._M_dataplus._M_p[0x34] = '\0';
  local_260._M_dataplus._M_p[0x35] = '\0';
  local_260._M_dataplus._M_p[0x36] = '\0';
  local_260._M_dataplus._M_p[0x37] = '\0';
  local_260._M_dataplus._M_p[0x38] = '\0';
  local_260._M_dataplus._M_p[0x39] = '\0';
  local_260._M_dataplus._M_p[0x3a] = '\0';
  local_260._M_dataplus._M_p[0x3b] = '\0';
  local_260._M_dataplus._M_p[0x3c] = '\0';
  local_260._M_dataplus._M_p[0x3d] = '\0';
  local_260._M_dataplus._M_p[0x3e] = '\0';
  local_260._M_dataplus._M_p[0x3f] = '\0';
  local_260._M_dataplus._M_p[0x40] = '\0';
  local_260._M_dataplus._M_p[0x41] = '\0';
  local_260._M_dataplus._M_p[0x42] = '\0';
  local_260._M_dataplus._M_p[0x43] = '\0';
  local_260._M_dataplus._M_p[0x44] = '\0';
  local_260._M_dataplus._M_p[0x45] = '\0';
  local_260._M_dataplus._M_p[0x46] = '\0';
  local_260._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_260._M_dataplus._M_p + 0x48) = local_260._M_dataplus._M_p + 0x60;
  *(pointer *)(local_260._M_dataplus._M_p + 0x50) = local_260._M_dataplus._M_p + 0x60;
  *(pointer *)(local_260._M_dataplus._M_p + 0x58) = local_260._M_dataplus._M_p + 0x80;
  local_260._M_dataplus._M_p[0x80] = '\0';
  local_260._M_dataplus._M_p[0x81] = '\0';
  local_260._M_dataplus._M_p[0x82] = '\0';
  local_260._M_dataplus._M_p[0x83] = '\0';
  local_260._M_dataplus._M_p[0x84] = '\0';
  local_260._M_dataplus._M_p[0x85] = '\0';
  local_260._M_dataplus._M_p[0x86] = '\0';
  local_260._M_dataplus._M_p[0x87] = '\0';
  local_260._M_dataplus._M_p[0x90] = '\0';
  local_260._M_dataplus._M_p[0x91] = '\0';
  local_260._M_dataplus._M_p[0x92] = '\0';
  local_260._M_dataplus._M_p[0x93] = '\0';
  local_260._M_dataplus._M_p[0x94] = '\0';
  local_260._M_dataplus._M_p[0x95] = '\0';
  local_260._M_dataplus._M_p[0x96] = '\0';
  local_260._M_dataplus._M_p[0x97] = '\0';
  *(allocator<char> **)(local_260._M_dataplus._M_p + 0x88) = local_23c;
  *(code **)(local_260._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/condition.cpp:34:29)>
       ::_M_invoke;
  *(code **)(local_260._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/condition.cpp:34:29)>
       ::_M_manager;
  local_260._M_dataplus._M_p[0xc0] = '\x01';
  local_260._M_dataplus._M_p[200] = '\0';
  local_260._M_dataplus._M_p[0xc9] = '\0';
  local_260._M_dataplus._M_p[0xca] = '\0';
  local_260._M_dataplus._M_p[0xcb] = '\0';
  local_260._M_dataplus._M_p[0xcc] = '\0';
  local_260._M_dataplus._M_p[0xcd] = '\0';
  local_260._M_dataplus._M_p[0xce] = '\0';
  local_260._M_dataplus._M_p[0xcf] = '\0';
  local_260._M_dataplus._M_p[0xd0] = '\0';
  local_260._M_dataplus._M_p[0xd1] = '\0';
  local_260._M_dataplus._M_p[0xd2] = '\0';
  local_260._M_dataplus._M_p[0xd3] = '\0';
  local_260._M_dataplus._M_p[0xd4] = '\0';
  local_260._M_dataplus._M_p[0xd5] = '\0';
  local_260._M_dataplus._M_p[0xd6] = '\0';
  local_260._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar1._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_260);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_260);
  v._M_head_impl =
       ((FVar1._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"B",&local_261);
  std::__cxx11::string::_M_assign((string *)&(v._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_260);
  FVar1._graph = local_228.super_FlowBuilder._graph;
  local_260._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_260._M_dataplus._M_p[0] = '\0';
  local_260._M_dataplus._M_p[1] = '\0';
  local_260._M_dataplus._M_p[2] = '\0';
  local_260._M_dataplus._M_p[3] = '\0';
  local_260._M_dataplus._M_p[4] = '\0';
  local_260._M_dataplus._M_p[5] = '\0';
  local_260._M_dataplus._M_p[6] = '\0';
  local_260._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_260._M_dataplus._M_p + 8) = local_260._M_dataplus._M_p + 0x18;
  local_260._M_dataplus._M_p[0x10] = '\0';
  local_260._M_dataplus._M_p[0x11] = '\0';
  local_260._M_dataplus._M_p[0x12] = '\0';
  local_260._M_dataplus._M_p[0x13] = '\0';
  local_260._M_dataplus._M_p[0x14] = '\0';
  local_260._M_dataplus._M_p[0x15] = '\0';
  local_260._M_dataplus._M_p[0x16] = '\0';
  local_260._M_dataplus._M_p[0x17] = '\0';
  local_260._M_dataplus._M_p[0x18] = '\0';
  local_260._M_dataplus._M_p[0x28] = '\0';
  local_260._M_dataplus._M_p[0x29] = '\0';
  local_260._M_dataplus._M_p[0x2a] = '\0';
  local_260._M_dataplus._M_p[0x2b] = '\0';
  local_260._M_dataplus._M_p[0x2c] = '\0';
  local_260._M_dataplus._M_p[0x2d] = '\0';
  local_260._M_dataplus._M_p[0x2e] = '\0';
  local_260._M_dataplus._M_p[0x2f] = '\0';
  local_260._M_dataplus._M_p[0x30] = '\0';
  local_260._M_dataplus._M_p[0x31] = '\0';
  local_260._M_dataplus._M_p[0x32] = '\0';
  local_260._M_dataplus._M_p[0x33] = '\0';
  local_260._M_dataplus._M_p[0x34] = '\0';
  local_260._M_dataplus._M_p[0x35] = '\0';
  local_260._M_dataplus._M_p[0x36] = '\0';
  local_260._M_dataplus._M_p[0x37] = '\0';
  local_260._M_dataplus._M_p[0x38] = '\0';
  local_260._M_dataplus._M_p[0x39] = '\0';
  local_260._M_dataplus._M_p[0x3a] = '\0';
  local_260._M_dataplus._M_p[0x3b] = '\0';
  local_260._M_dataplus._M_p[0x3c] = '\0';
  local_260._M_dataplus._M_p[0x3d] = '\0';
  local_260._M_dataplus._M_p[0x3e] = '\0';
  local_260._M_dataplus._M_p[0x3f] = '\0';
  local_260._M_dataplus._M_p[0x40] = '\0';
  local_260._M_dataplus._M_p[0x41] = '\0';
  local_260._M_dataplus._M_p[0x42] = '\0';
  local_260._M_dataplus._M_p[0x43] = '\0';
  local_260._M_dataplus._M_p[0x44] = '\0';
  local_260._M_dataplus._M_p[0x45] = '\0';
  local_260._M_dataplus._M_p[0x46] = '\0';
  local_260._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_260._M_dataplus._M_p + 0x48) = local_260._M_dataplus._M_p + 0x60;
  *(pointer *)(local_260._M_dataplus._M_p + 0x50) = local_260._M_dataplus._M_p + 0x60;
  *(pointer *)(local_260._M_dataplus._M_p + 0x58) = local_260._M_dataplus._M_p + 0x80;
  local_260._M_dataplus._M_p[0x80] = '\0';
  local_260._M_dataplus._M_p[0x81] = '\0';
  local_260._M_dataplus._M_p[0x82] = '\0';
  local_260._M_dataplus._M_p[0x83] = '\0';
  local_260._M_dataplus._M_p[0x84] = '\0';
  local_260._M_dataplus._M_p[0x85] = '\0';
  local_260._M_dataplus._M_p[0x86] = '\0';
  local_260._M_dataplus._M_p[0x87] = '\0';
  local_260._M_dataplus._M_p[0x90] = '\0';
  local_260._M_dataplus._M_p[0x91] = '\0';
  local_260._M_dataplus._M_p[0x92] = '\0';
  local_260._M_dataplus._M_p[0x93] = '\0';
  local_260._M_dataplus._M_p[0x94] = '\0';
  local_260._M_dataplus._M_p[0x95] = '\0';
  local_260._M_dataplus._M_p[0x96] = '\0';
  local_260._M_dataplus._M_p[0x97] = '\0';
  *(allocator<char> **)(local_260._M_dataplus._M_p + 0x88) = local_23c;
  *(code **)(local_260._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/condition.cpp:39:29)>
       ::_M_invoke;
  *(code **)(local_260._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/condition.cpp:39:29)>
       ::_M_manager;
  local_260._M_dataplus._M_p[0xc0] = '\x04';
  local_260._M_dataplus._M_p[200] = '\0';
  local_260._M_dataplus._M_p[0xc9] = '\0';
  local_260._M_dataplus._M_p[0xca] = '\0';
  local_260._M_dataplus._M_p[0xcb] = '\0';
  local_260._M_dataplus._M_p[0xcc] = '\0';
  local_260._M_dataplus._M_p[0xcd] = '\0';
  local_260._M_dataplus._M_p[0xce] = '\0';
  local_260._M_dataplus._M_p[0xcf] = '\0';
  local_260._M_dataplus._M_p[0xd0] = '\0';
  local_260._M_dataplus._M_p[0xd1] = '\0';
  local_260._M_dataplus._M_p[0xd2] = '\0';
  local_260._M_dataplus._M_p[0xd3] = '\0';
  local_260._M_dataplus._M_p[0xd4] = '\0';
  local_260._M_dataplus._M_p[0xd5] = '\0';
  local_260._M_dataplus._M_p[0xd6] = '\0';
  local_260._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar1._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_260);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_260);
  this_00._M_head_impl =
       ((FVar1._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"C",&local_261);
  std::__cxx11::string::_M_assign((string *)&(this_00._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_260);
  local_260._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_260._M_dataplus._M_p[0] = '\0';
  local_260._M_dataplus._M_p[1] = '\0';
  local_260._M_dataplus._M_p[2] = '\0';
  local_260._M_dataplus._M_p[3] = '\0';
  local_260._M_dataplus._M_p[4] = '\0';
  local_260._M_dataplus._M_p[5] = '\0';
  local_260._M_dataplus._M_p[6] = '\0';
  local_260._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_260._M_dataplus._M_p + 8) = local_260._M_dataplus._M_p + 0x18;
  local_260._M_dataplus._M_p[0x10] = '\0';
  local_260._M_dataplus._M_p[0x11] = '\0';
  local_260._M_dataplus._M_p[0x12] = '\0';
  local_260._M_dataplus._M_p[0x13] = '\0';
  local_260._M_dataplus._M_p[0x14] = '\0';
  local_260._M_dataplus._M_p[0x15] = '\0';
  local_260._M_dataplus._M_p[0x16] = '\0';
  local_260._M_dataplus._M_p[0x17] = '\0';
  local_260._M_dataplus._M_p[0x18] = '\0';
  local_260._M_dataplus._M_p[0x28] = '\0';
  local_260._M_dataplus._M_p[0x29] = '\0';
  local_260._M_dataplus._M_p[0x2a] = '\0';
  local_260._M_dataplus._M_p[0x2b] = '\0';
  local_260._M_dataplus._M_p[0x2c] = '\0';
  local_260._M_dataplus._M_p[0x2d] = '\0';
  local_260._M_dataplus._M_p[0x2e] = '\0';
  local_260._M_dataplus._M_p[0x2f] = '\0';
  local_260._M_dataplus._M_p[0x30] = '\0';
  local_260._M_dataplus._M_p[0x31] = '\0';
  local_260._M_dataplus._M_p[0x32] = '\0';
  local_260._M_dataplus._M_p[0x33] = '\0';
  local_260._M_dataplus._M_p[0x34] = '\0';
  local_260._M_dataplus._M_p[0x35] = '\0';
  local_260._M_dataplus._M_p[0x36] = '\0';
  local_260._M_dataplus._M_p[0x37] = '\0';
  local_260._M_dataplus._M_p[0x38] = '\0';
  local_260._M_dataplus._M_p[0x39] = '\0';
  local_260._M_dataplus._M_p[0x3a] = '\0';
  local_260._M_dataplus._M_p[0x3b] = '\0';
  local_260._M_dataplus._M_p[0x3c] = '\0';
  local_260._M_dataplus._M_p[0x3d] = '\0';
  local_260._M_dataplus._M_p[0x3e] = '\0';
  local_260._M_dataplus._M_p[0x3f] = '\0';
  local_260._M_dataplus._M_p[0x40] = '\0';
  local_260._M_dataplus._M_p[0x41] = '\0';
  local_260._M_dataplus._M_p[0x42] = '\0';
  local_260._M_dataplus._M_p[0x43] = '\0';
  local_260._M_dataplus._M_p[0x44] = '\0';
  local_260._M_dataplus._M_p[0x45] = '\0';
  local_260._M_dataplus._M_p[0x46] = '\0';
  local_260._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_260._M_dataplus._M_p + 0x48) = local_260._M_dataplus._M_p + 0x60;
  *(pointer *)(local_260._M_dataplus._M_p + 0x50) = local_260._M_dataplus._M_p + 0x60;
  *(pointer *)(local_260._M_dataplus._M_p + 0x58) = local_260._M_dataplus._M_p + 0x80;
  local_260._M_dataplus._M_p[0x80] = '\0';
  local_260._M_dataplus._M_p[0x81] = '\0';
  local_260._M_dataplus._M_p[0x82] = '\0';
  local_260._M_dataplus._M_p[0x83] = '\0';
  local_260._M_dataplus._M_p[0x84] = '\0';
  local_260._M_dataplus._M_p[0x85] = '\0';
  local_260._M_dataplus._M_p[0x86] = '\0';
  local_260._M_dataplus._M_p[0x87] = '\0';
  local_260._M_dataplus._M_p[0x90] = '\0';
  local_260._M_dataplus._M_p[0x91] = '\0';
  local_260._M_dataplus._M_p[0x92] = '\0';
  local_260._M_dataplus._M_p[0x93] = '\0';
  local_260._M_dataplus._M_p[0x94] = '\0';
  local_260._M_dataplus._M_p[0x95] = '\0';
  local_260._M_dataplus._M_p[0x96] = '\0';
  local_260._M_dataplus._M_p[0x97] = '\0';
  *(allocator<char> **)(local_260._M_dataplus._M_p + 0x88) = local_23c;
  *(code **)(local_260._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/condition.cpp:49:29)>
       ::_M_invoke;
  *(code **)(local_260._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/condition.cpp:49:29)>
       ::_M_manager;
  local_260._M_dataplus._M_p[0xc0] = '\x01';
  local_260._M_dataplus._M_p[200] = '\0';
  local_260._M_dataplus._M_p[0xc9] = '\0';
  local_260._M_dataplus._M_p[0xca] = '\0';
  local_260._M_dataplus._M_p[0xcb] = '\0';
  local_260._M_dataplus._M_p[0xcc] = '\0';
  local_260._M_dataplus._M_p[0xcd] = '\0';
  local_260._M_dataplus._M_p[0xce] = '\0';
  local_260._M_dataplus._M_p[0xcf] = '\0';
  local_260._M_dataplus._M_p[0xd0] = '\0';
  local_260._M_dataplus._M_p[0xd1] = '\0';
  local_260._M_dataplus._M_p[0xd2] = '\0';
  local_260._M_dataplus._M_p[0xd3] = '\0';
  local_260._M_dataplus._M_p[0xd4] = '\0';
  local_260._M_dataplus._M_p[0xd5] = '\0';
  local_260._M_dataplus._M_p[0xd6] = '\0';
  local_260._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)local_228.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_260);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_260);
  v_00._M_head_impl =
       ((local_228.super_FlowBuilder._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"D",&local_261);
  std::__cxx11::string::_M_assign((string *)&(v_00._M_head_impl)->_name);
  std::__cxx11::string::~string((string *)&local_260);
  tf::Node::_precede(this._M_head_impl,v._M_head_impl);
  tf::Node::_precede(v._M_head_impl,this_00._M_head_impl);
  tf::Node::_precede(this_00._M_head_impl,v._M_head_impl);
  tf::Node::_precede(this_00._M_head_impl,v_00._M_head_impl);
  tf::Taskflow::dump(&local_228,(ostream *)&std::cout);
  this_01 = &local_160;
  tf::Executor::run((Future<void> *)&local_260,this_01,&local_228);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_260,this_01);
  tf::Future<void>::~Future((Future<void> *)&local_260);
  tf::Taskflow::~Taskflow(&local_228);
  tf::Executor::~Executor(&local_160);
  return 0;
}

Assistant:

int main() {

  tf::Executor executor;
  tf::Taskflow taskflow("Conditional Tasking Demo");

  int counter;

  auto A = taskflow.emplace([&](){
    std::cout << "initializes the counter to zero\n";
    counter = 0;
  }).name("A");

  auto B = taskflow.emplace([&](){
    std::cout << "loops to increment the counter\n";
    counter++;
  }).name("B");

  auto C = taskflow.emplace([&](){
    std::cout << "counter is " << counter << " -> ";
    if(counter != 5) {
      std::cout << "loops again (goes to B)\n";
      return 0;
    }
    std::cout << "breaks the loop (goes to D)\n";
    return 1;
  }).name("C");

  auto D = taskflow.emplace([&](){
    std::cout << "done with counter equal to " << counter << '\n';
  }).name("D");

  A.precede(B);
  B.precede(C);
  C.precede(B);
  C.precede(D);

  // visualizes the taskflow
  taskflow.dump(std::cout);

  // executes the taskflow
  executor.run(taskflow).wait();

  assert(counter == 5);

  return 0;
}